

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O1

void __thiscall
Rml::ElementBackgroundBorder::GenerateGeometry(ElementBackgroundBorder *this,Element *element)

{
  float fVar1;
  uint uVar2;
  Colourb CVar3;
  code *pcVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pBVar7;
  undefined1 auVar8 [8];
  bool bVar9;
  int iVar10;
  RenderManager *mesh_00;
  Element *element_00;
  Property *this_00;
  Background *this_01;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int i;
  int index;
  bool bVar15;
  float fVar16;
  CornerSizes border_radius;
  ColourbPremultiplied border_colors [4];
  Mesh mesh;
  BoxShadowList *in_stack_fffffffffffffec8;
  vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> local_118;
  ColourbPremultiplied local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  ComputedValues *local_e0;
  ElementBackgroundBorder *local_d8;
  undefined1 local_d0 [16];
  pointer local_c0;
  Mesh local_b8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_60 [8];
  float local_58;
  
  mesh_00 = Element::GetRenderManager(element);
  if (mesh_00 != (RenderManager *)0x0) {
    local_e0 = Element::GetComputedValues(element);
    uVar2 = *(uint *)&local_e0->rare;
    bVar15 = (uVar2 >> 0x1c & 1) != 0;
    fVar1 = (local_e0->inherited).opacity;
    bVar9 = 1.0 <= fVar1;
    CVar3 = (local_e0->common).background_color;
    uVar13 = (uint)CVar3 >> 0x18;
    if (bVar9 || bVar15) {
      uVar11 = ((((uint)CVar3 >> 8 & 0xff) * uVar13) / 0xff & 0xff) << 8;
      uVar13 = (((uint)CVar3 & 0xff) * uVar13) / 0xff & 0xff | (uint)CVar3 & 0xff000000 |
               ((((uint)CVar3 >> 0x10 & 0xff) * uVar13) / 0xff & 0xff) << 0x10;
    }
    else {
      fVar16 = ((float)uVar13 * fVar1) / 255.0;
      uVar11 = ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar16) & 0xffU) << 8 |
               ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar16) & 0xffU) << 0x10 |
               (int)((float)uVar13 * fVar1) << 0x18;
      uVar13 = (int)((float)((uint)CVar3 & 0xff) * fVar16) & 0xff;
    }
    CVar3 = (local_e0->common).border_top_color;
    uVar14 = (uint)CVar3 >> 0x18;
    if (bVar9 || bVar15) {
      uVar12 = ((((uint)CVar3 >> 8 & 0xff) * uVar14) / 0xff & 0xff) << 8;
      uVar14 = (((uint)CVar3 & 0xff) * uVar14) / 0xff & 0xff | (uint)CVar3 & 0xff000000 |
               ((((uint)CVar3 >> 0x10 & 0xff) * uVar14) / 0xff & 0xff) << 0x10;
    }
    else {
      fVar16 = ((float)uVar14 * fVar1) / 255.0;
      uVar12 = ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar16) & 0xffU) << 8 |
               ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar16) & 0xffU) << 0x10 |
               (int)((float)uVar14 * fVar1) << 0x18;
      uVar14 = (int)((float)((uint)CVar3 & 0xff) * fVar16) & 0xff;
    }
    local_f8 = (ColourbPremultiplied)(uVar14 | uVar12);
    CVar3 = (local_e0->common).border_right_color;
    uVar14 = (uint)CVar3 >> 0x18;
    if (bVar9 || bVar15) {
      uVar12 = ((((uint)CVar3 >> 8 & 0xff) * uVar14) / 0xff & 0xff) << 8;
      local_f4 = (((uint)CVar3 & 0xff) * uVar14) / 0xff & 0xff | (uint)CVar3 & 0xff000000 |
                 ((((uint)CVar3 >> 0x10 & 0xff) * uVar14) / 0xff & 0xff) << 0x10;
    }
    else {
      fVar16 = ((float)uVar14 * fVar1) / 255.0;
      uVar12 = ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar16) & 0xffU) << 8 |
               ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar16) & 0xffU) << 0x10 |
               (int)((float)uVar14 * fVar1) << 0x18;
      local_f4 = (int)((float)((uint)CVar3 & 0xff) * fVar16) & 0xff;
    }
    local_f4 = local_f4 | uVar12;
    CVar3 = (local_e0->common).border_bottom_color;
    uVar14 = (uint)CVar3 >> 0x18;
    if (bVar9 || bVar15) {
      uVar12 = ((((uint)CVar3 >> 8 & 0xff) * uVar14) / 0xff & 0xff) << 8;
      local_f0 = (((uint)CVar3 & 0xff) * uVar14) / 0xff & 0xff | (uint)CVar3 & 0xff000000 |
                 ((((uint)CVar3 >> 0x10 & 0xff) * uVar14) / 0xff & 0xff) << 0x10;
    }
    else {
      fVar16 = ((float)uVar14 * fVar1) / 255.0;
      uVar12 = ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar16) & 0xffU) << 8 |
               ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar16) & 0xffU) << 0x10 |
               (int)((float)uVar14 * fVar1) << 0x18;
      local_f0 = (int)((float)((uint)CVar3 & 0xff) * fVar16) & 0xff;
    }
    local_f0 = local_f0 | uVar12;
    CVar3 = (local_e0->common).border_left_color;
    uVar14 = (uint)CVar3 >> 0x18;
    if (bVar9 || bVar15) {
      uVar12 = ((((uint)CVar3 >> 8 & 0xff) * uVar14) / 0xff & 0xff) << 8;
      local_ec = (((uint)CVar3 & 0xff) * uVar14) / 0xff & 0xff | (uint)CVar3 & 0xff000000 |
                 ((((uint)CVar3 >> 0x10 & 0xff) * uVar14) / 0xff & 0xff) << 0x10;
    }
    else {
      fVar16 = (fVar1 * (float)uVar14) / 255.0;
      uVar12 = ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar16) & 0xffU) << 8 |
               ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar16) & 0xffU) << 0x10 |
               (int)(fVar1 * (float)uVar14) << 0x18;
      local_ec = (int)((float)((uint)CVar3 & 0xff) * fVar16) & 0xff;
    }
    local_ec = local_ec | uVar12;
    local_78 = CONCAT44((float)(int)(local_e0->rare).border_top_right_radius,
                        (float)(int)(local_e0->rare).border_top_left_radius);
    uStack_70 = 0;
    local_88 = CONCAT44((float)(int)(local_e0->rare).border_bottom_left_radius,
                        (float)(int)(local_e0->rare).border_bottom_right_radius);
    uStack_80 = 0;
    index = 0;
    local_d8 = this;
    element_00 = (Element *)GetOrCreateBackground(this,BackgroundBorder);
    Geometry::Release(&local_b8,(Geometry *)element_00,ClearMesh);
    while( true ) {
      iVar10 = Element::GetNumBoxes(element);
      if (iVar10 <= index) break;
      Element::GetRenderBox((RenderBox *)local_60,element,Padding,index);
      MeshUtilities::GenerateBackgroundBorder
                (&local_b8,(RenderBox *)local_60,(ColourbPremultiplied)(uVar13 | uVar11),&local_f8);
      index = index + 1;
    }
    RenderManager::MakeGeometry((RenderManager *)local_60,(Mesh *)mesh_00);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                        *)element_00);
    fVar1 = local_58;
    auVar8 = local_60;
    local_60._0_4_ = 0.0;
    local_60._4_4_ = 0.0;
    (element_00->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)auVar8;
    local_58 = -NAN;
    *(float *)&(element_00->super_EnableObserverPtr<Rml::Element>).block = fVar1;
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                        *)local_60);
    if ((uVar2 >> 0x1c & 1) != 0) {
      this_00 = Element::GetLocalProperty(element,BoxShadow);
      if ((this_00->value).type != BOXSHADOWLIST) {
        bVar9 = Assert("RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementBackgroundBorder.cpp"
                       ,0xa3);
        if (!bVar9) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
      }
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Variant::GetInto<std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>,_0>
                (&this_00->value,&local_118);
      pBVar7 = local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
      pBVar6 = local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pBVar5 = local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01 = GetOrCreateBackground(local_d8,BoxShadow);
      local_d0._0_8_ = pBVar5;
      local_d0._8_8_ = pBVar6;
      local_c0 = pBVar7;
      border_radius._M_elems[2] = (float)(undefined4)local_88;
      border_radius._M_elems[3] = (float)local_88._4_4_;
      border_radius._M_elems[0] = (float)(undefined4)local_78;
      border_radius._M_elems[1] = (float)local_78._4_4_;
      GeometryBoxShadow::Generate
                ((GeometryBoxShadow *)this_01,(Geometry *)&this_01->texture,
                 (CallbackTexture *)mesh_00,(RenderManager *)element,element_00,(Geometry *)local_d0
                 ,in_stack_fffffffffffffec8,border_radius,(local_e0->inherited).opacity);
      if ((RenderManager *)local_d0._0_8_ != (RenderManager *)0x0) {
        operator_delete((void *)local_d0._0_8_,(long)local_c0 - local_d0._0_8_);
      }
    }
    if (local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b8.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.vertices.
                      super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.vertices.
                            super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.vertices.
                            super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void ElementBackgroundBorder::GenerateGeometry(Element* element)
{
	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return;

	const ComputedValues& computed = element->GetComputedValues();
	const bool has_box_shadow = computed.has_box_shadow();
	const float opacity = computed.opacity();

	// Apply opacity except if we have a box shadow. In the latter case the background is rendered opaquely into the box-shadow texture, while
	// opacity is applied to the entire box-shadow texture when that is rendered.
	bool apply_opacity = (!has_box_shadow && opacity < 1.f);

	auto ConvertColor = [=](Colourb color) {
		if (apply_opacity)
			return color.ToPremultiplied(opacity);
		else
			return color.ToPremultiplied();
	};

	ColourbPremultiplied background_color = ConvertColor(computed.background_color());
	ColourbPremultiplied border_colors[4] = {
		ConvertColor(computed.border_top_color()),
		ConvertColor(computed.border_right_color()),
		ConvertColor(computed.border_bottom_color()),
		ConvertColor(computed.border_left_color()),
	};
	const CornerSizes border_radius = computed.border_radius();

	Geometry& geometry = GetOrCreateBackground(BackgroundType::BackgroundBorder).geometry;
	Mesh mesh = geometry.Release(Geometry::ReleaseMode::ClearMesh);

	for (int i = 0; i < element->GetNumBoxes(); i++)
		MeshUtilities::GenerateBackgroundBorder(mesh, element->GetRenderBox(BoxArea::Padding, i), background_color, border_colors);

	geometry = render_manager->MakeGeometry(std::move(mesh));

	if (has_box_shadow)
	{
		Geometry& background_border_geometry = geometry;

		const Property* p_box_shadow = element->GetLocalProperty(PropertyId::BoxShadow);
		RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST);
		BoxShadowList shadow_list = p_box_shadow->value.Get<BoxShadowList>();

		// Generate the geometry for the box-shadow texture.
		Background& shadow_background = GetOrCreateBackground(BackgroundType::BoxShadow);
		Geometry& shadow_geometry = shadow_background.geometry;
		CallbackTexture& shadow_texture = shadow_background.texture;

		GeometryBoxShadow::Generate(shadow_geometry, shadow_texture, *render_manager, element, background_border_geometry, std::move(shadow_list),
			border_radius, computed.opacity());
	}
}